

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleoption.cpp
# Opt level: O3

qreal QStyleOptionGraphicsItem::levelOfDetailFromTransform(QTransform *worldTransform)

{
  int iVar1;
  long in_FS_OFFSET;
  qreal qVar2;
  double dVar3;
  double dVar4;
  QLineF local_a8;
  QLineF local_88;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = QTransform::type();
  if (iVar1 < 2) {
    qVar2 = 1.0;
  }
  else {
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0x3ff0000000000000;
    uStack_30 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_58 = 0;
    local_50 = 0x3ff0000000000000;
    QTransform::map(&local_88);
    dVar3 = (double)QLineF::length();
    QTransform::map(&local_a8);
    dVar4 = (double)QLineF::length();
    dVar4 = dVar4 * dVar3;
    if (dVar4 < 0.0) {
      qVar2 = sqrt(dVar4);
    }
    else {
      qVar2 = SQRT(dVar4);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return qVar2;
  }
  __stack_chk_fail();
}

Assistant:

qreal QStyleOptionGraphicsItem::levelOfDetailFromTransform(const QTransform &worldTransform)
{
    if (worldTransform.type() <= QTransform::TxTranslate)
        return 1; // Translation only? The LOD is 1.

    // Two unit vectors.
    QLineF v1(0, 0, 1, 0);
    QLineF v2(0, 0, 0, 1);
    // LOD is the transformed area of a 1x1 rectangle.
    return qSqrt(worldTransform.map(v1).length() * worldTransform.map(v2).length());
}